

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

int __thiscall
UnifiedRegex::ChompCharInst<(UnifiedRegex::ChompMode)0>::Print
          (ChompCharInst<(UnifiedRegex::ChompMode)0> *this,DebugWriter *w,Label label,Char *litbuf)

{
  undefined4 in_register_00000014;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015d347d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",3);
  }
  DebugWriter::Print(w,L"ChompChar<Star>");
  DebugWriter::Print(w,L"(");
  DebugWriter::Print(w,L"c: ");
  DebugWriter::PrintQuotedChar(w,(this->super_CharMixin).c);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015d347d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::CharMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_CharMixin,L"CharMixin");
    DebugWriter::Unindent(w);
  }
  return 3;
}

Assistant:

int ChompCharInst<Mode>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (Mode == ChompMode::Star)
        {
            PRINT_RE_BYTECODE_BEGIN("ChompChar<Star>");
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("ChompChar<Plus>");
        }

        PRINT_MIXIN(CharMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(CharMixin);
        PRINT_RE_BYTECODE_END();
    }